

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

wchar_t parse_cmd(EditLine *el,wchar_t *cmd)

{
  el_bindings_t *peVar1;
  int iVar2;
  ulong local_30;
  size_t i;
  el_bindings_t *b;
  wchar_t *cmd_local;
  EditLine *el_local;
  
  peVar1 = (el->el_map).help;
  local_30 = 0;
  while( true ) {
    if ((el->el_map).nfunc <= local_30) {
      return L'\xffffffff';
    }
    iVar2 = wcscmp(peVar1[local_30].name,cmd);
    if (iVar2 == 0) break;
    local_30 = local_30 + 1;
  }
  return peVar1[local_30].func;
}

Assistant:

libedit_private int
parse_cmd(EditLine *el, const wchar_t *cmd)
{
	el_bindings_t *b = el->el_map.help;
	size_t i;

	for (i = 0; i < el->el_map.nfunc; i++)
		if (wcscmp(b[i].name, cmd) == 0)
			return b[i].func;
	return -1;
}